

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O3

int htmlParseDocument(htmlParserCtxtPtr ctxt)

{
  xmlParserInputPtr in;
  setDocumentLocatorSAXFunc p_Var1;
  void *pvVar2;
  xmlChar *pxVar3;
  startDocumentSAXFunc p_Var4;
  __int32_t *p_Var5;
  endDocumentSAXFunc p_Var6;
  xmlCharEncoding enc;
  xmlSAXLocator *pxVar7;
  __int32_t **pp_Var8;
  xmlDtdPtr pxVar9;
  int iVar10;
  xmlChar start [4];
  xmlChar local_24;
  xmlChar local_23;
  xmlChar local_22;
  xmlChar local_21;
  
  xmlInitParser();
  htmlDefaultSAXHandlerInit();
  if (ctxt == (htmlParserCtxtPtr)0x0) {
    __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,(void *)0x0,
                    (void *)0x0,5,1,XML_ERR_ERROR,(char *)0x0,0,(char *)0x0,(char *)0x0,(char *)0x0,
                    0,0,"htmlParseDocument: context error\n",0,0);
    iVar10 = 1;
  }
  else {
    in = ctxt->input;
    if (in == (xmlParserInputPtr)0x0) {
      iVar10 = 1;
      htmlParseErr(ctxt,XML_ERR_INTERNAL_ERROR,"htmlParseDocument: context error\n",(xmlChar *)0x0,
                   (xmlChar *)0x0);
    }
    else {
      ctxt->html = 1;
      ctxt->linenumbers = 1;
      if ((ctxt->progressive == 0) && ((long)in->end - (long)in->cur < 0xfa)) {
        xmlParserInputGrow(in,0xfa);
      }
      if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
         (p_Var1 = ctxt->sax->setDocumentLocator, p_Var1 != (setDocumentLocatorSAXFunc)0x0)) {
        pvVar2 = ctxt->userData;
        pxVar7 = __xmlDefaultSAXLocator();
        (*p_Var1)(pvVar2,pxVar7);
      }
      if ((ctxt->encoding == (xmlChar *)0x0) &&
         (pxVar3 = ctxt->input->cur, 3 < (long)ctxt->input->end - (long)pxVar3)) {
        local_24 = 0xff;
        if (ctxt->token == 0) {
          local_24 = *pxVar3;
        }
        local_23 = pxVar3[1];
        local_22 = pxVar3[2];
        local_21 = pxVar3[3];
        enc = xmlDetectCharEncoding(&local_24,4);
        if (enc != XML_CHAR_ENCODING_NONE) {
          xmlSwitchEncoding(ctxt,enc);
        }
      }
      htmlSkipBlankChars(ctxt);
      if (*ctxt->input->cur == '\0') {
        htmlParseErr(ctxt,XML_ERR_DOCUMENT_EMPTY,"Document is empty\n",(xmlChar *)0x0,(xmlChar *)0x0
                    );
      }
      if (((ctxt->sax != (_xmlSAXHandler *)0x0) &&
          (p_Var4 = ctxt->sax->startDocument, p_Var4 != (startDocumentSAXFunc)0x0)) &&
         (ctxt->disableSAX == 0)) {
        (*p_Var4)(ctxt->userData);
      }
      while (pxVar3 = ctxt->input->cur, *pxVar3 == '<') {
        if (pxVar3[1] != '?') {
          if (pxVar3[1] != '!') break;
          if ((pxVar3[2] != '-') || (pxVar3[3] != '-')) {
            pp_Var8 = __ctype_toupper_loc();
            p_Var5 = *pp_Var8;
            if ((((p_Var5[pxVar3[2]] == 0x44) &&
                 ((p_Var5[pxVar3[3]] == 0x4f && (p_Var5[pxVar3[4]] == 0x43)))) &&
                (p_Var5[pxVar3[5]] == 0x54)) &&
               (((p_Var5[pxVar3[6]] == 0x59 && (p_Var5[pxVar3[7]] == 0x50)) &&
                (p_Var5[pxVar3[8]] == 0x45)))) {
              htmlParseDocTypeDecl(ctxt);
            }
            break;
          }
        }
        htmlParseComment(ctxt);
        htmlParsePI(ctxt);
        htmlSkipBlankChars(ctxt);
      }
      while( true ) {
        htmlSkipBlankChars(ctxt);
        pxVar3 = ctxt->input->cur;
        if ((*pxVar3 != '<') ||
           ((pxVar3[1] != '?' && (((pxVar3[1] != '!' || (pxVar3[2] != '-')) || (pxVar3[3] != '-'))))
           )) break;
        htmlParseComment(ctxt);
        htmlParsePI(ctxt);
      }
      htmlParseContentInternal(ctxt);
      if (*ctxt->input->cur == '\0') {
        htmlAutoCloseOnEnd(ctxt);
      }
      if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
         (p_Var6 = ctxt->sax->endDocument, p_Var6 != (endDocumentSAXFunc)0x0)) {
        (*p_Var6)(ctxt->userData);
      }
      if (((ctxt->options & 4) == 0) && (ctxt->myDoc != (xmlDoc *)0x0)) {
        pxVar9 = xmlGetIntSubset(ctxt->myDoc);
        if (pxVar9 == (xmlDtdPtr)0x0) {
          pxVar9 = xmlCreateIntSubset(ctxt->myDoc,"html",
                                      (xmlChar *)"-//W3C//DTD HTML 4.0 Transitional//EN",
                                      (xmlChar *)"http://www.w3.org/TR/REC-html40/loose.dtd");
          ctxt->myDoc->intSubset = pxVar9;
        }
      }
      iVar10 = -(uint)(ctxt->wellFormed == 0);
    }
  }
  return iVar10;
}

Assistant:

int
htmlParseDocument(htmlParserCtxtPtr ctxt) {
    xmlChar start[4];
    xmlCharEncoding enc;
    xmlDtdPtr dtd;

    xmlInitParser();

    htmlDefaultSAXHandlerInit();

    if ((ctxt == NULL) || (ctxt->input == NULL)) {
	htmlParseErr(ctxt, XML_ERR_INTERNAL_ERROR,
		     "htmlParseDocument: context error\n", NULL, NULL);
	return(XML_ERR_INTERNAL_ERROR);
    }
    ctxt->html = 1;
    ctxt->linenumbers = 1;
    GROW;
    /*
     * SAX: beginning of the document processing.
     */
    if ((ctxt->sax) && (ctxt->sax->setDocumentLocator))
        ctxt->sax->setDocumentLocator(ctxt->userData, &xmlDefaultSAXLocator);

    if ((ctxt->encoding == (const xmlChar *)XML_CHAR_ENCODING_NONE) &&
        ((ctxt->input->end - ctxt->input->cur) >= 4)) {
	/*
	 * Get the 4 first bytes and decode the charset
	 * if enc != XML_CHAR_ENCODING_NONE
	 * plug some encoding conversion routines.
	 */
	start[0] = RAW;
	start[1] = NXT(1);
	start[2] = NXT(2);
	start[3] = NXT(3);
	enc = xmlDetectCharEncoding(&start[0], 4);
	if (enc != XML_CHAR_ENCODING_NONE) {
	    xmlSwitchEncoding(ctxt, enc);
	}
    }

    /*
     * Wipe out everything which is before the first '<'
     */
    SKIP_BLANKS;
    if (CUR == 0) {
	htmlParseErr(ctxt, XML_ERR_DOCUMENT_EMPTY,
	             "Document is empty\n", NULL, NULL);
    }

    if ((ctxt->sax) && (ctxt->sax->startDocument) && (!ctxt->disableSAX))
	ctxt->sax->startDocument(ctxt->userData);


    /*
     * Parse possible comments and PIs before any content
     */
    while (((CUR == '<') && (NXT(1) == '!') &&
            (NXT(2) == '-') && (NXT(3) == '-')) ||
	   ((CUR == '<') && (NXT(1) == '?'))) {
        htmlParseComment(ctxt);
        htmlParsePI(ctxt);
	SKIP_BLANKS;
    }


    /*
     * Then possibly doc type declaration(s) and more Misc
     * (doctypedecl Misc*)?
     */
    if ((CUR == '<') && (NXT(1) == '!') &&
	(UPP(2) == 'D') && (UPP(3) == 'O') &&
	(UPP(4) == 'C') && (UPP(5) == 'T') &&
	(UPP(6) == 'Y') && (UPP(7) == 'P') &&
	(UPP(8) == 'E')) {
	htmlParseDocTypeDecl(ctxt);
    }
    SKIP_BLANKS;

    /*
     * Parse possible comments and PIs before any content
     */
    while (((CUR == '<') && (NXT(1) == '!') &&
            (NXT(2) == '-') && (NXT(3) == '-')) ||
	   ((CUR == '<') && (NXT(1) == '?'))) {
        htmlParseComment(ctxt);
        htmlParsePI(ctxt);
	SKIP_BLANKS;
    }

    /*
     * Time to start parsing the tree itself
     */
    htmlParseContentInternal(ctxt);

    /*
     * autoclose
     */
    if (CUR == 0)
	htmlAutoCloseOnEnd(ctxt);


    /*
     * SAX: end of the document processing.
     */
    if ((ctxt->sax) && (ctxt->sax->endDocument != NULL))
        ctxt->sax->endDocument(ctxt->userData);

    if ((!(ctxt->options & HTML_PARSE_NODEFDTD)) && (ctxt->myDoc != NULL)) {
	dtd = xmlGetIntSubset(ctxt->myDoc);
	if (dtd == NULL)
	    ctxt->myDoc->intSubset =
		xmlCreateIntSubset(ctxt->myDoc, BAD_CAST "html",
		    BAD_CAST "-//W3C//DTD HTML 4.0 Transitional//EN",
		    BAD_CAST "http://www.w3.org/TR/REC-html40/loose.dtd");
    }
    if (! ctxt->wellFormed) return(-1);
    return(0);
}